

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont_p.h
# Opt level: O2

void __thiscall QRawFontPrivate::QRawFontPrivate(QRawFontPrivate *this,QRawFontPrivate *other)

{
  QFontEngine *pQVar1;
  
  pQVar1 = other->fontEngine;
  this->fontEngine = pQVar1;
  this->hintingPreference = other->hintingPreference;
  (this->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  this->thread = other->thread;
  if (pQVar1 != (QFontEngine *)0x0) {
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

QRawFontPrivate(const QRawFontPrivate &other)
        : fontEngine(other.fontEngine)
        , hintingPreference(other.hintingPreference)
        , thread(other.thread)
    {
#ifndef QT_NO_DEBUG
        Q_ASSERT(fontEngine == nullptr || thread == QThread::currentThread());
#endif
        if (fontEngine != nullptr)
            fontEngine->ref.ref();
    }